

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_rsassa_pkcs1_v15_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  ulong uVar1;
  uchar uVar2;
  long lVar3;
  size_t sVar4;
  byte bVar5;
  int iVar6;
  mbedtls_md_info_t *md_info;
  uchar *output;
  uchar *output_00;
  size_t sVar7;
  long lVar8;
  ulong __n;
  uchar diff_no_optimize;
  size_t oid_size;
  char *oid;
  mbedtls_rsa_context *local_48;
  _func_int_void_ptr_uchar_ptr_size_t *local_40;
  void *local_38;
  
  oid_size = 0;
  oid = (char *)0x0;
  if ((mode != 1) || (iVar6 = -0x4080, ctx->padding == 0)) {
    uVar1 = ctx->len;
    local_40 = f_rng;
    local_38 = p_rng;
    if (md_alg == MBEDTLS_MD_NONE) {
      lVar8 = uVar1 - 3;
    }
    else {
      local_48 = ctx;
      md_info = mbedtls_md_info_from_type(md_alg);
      if (md_info == (mbedtls_md_info_t *)0x0) {
        return -0x4080;
      }
      iVar6 = mbedtls_oid_get_oid_by_md(md_alg,&oid,&oid_size);
      if (iVar6 != 0) {
        return -0x4080;
      }
      lVar8 = (uVar1 - oid_size) + -0xd;
      bVar5 = mbedtls_md_get_size(md_info);
      hashlen = (uint)bVar5;
      ctx = local_48;
    }
    __n = lVar8 - (ulong)hashlen;
    iVar6 = -0x4080;
    if (__n <= uVar1 && 7 < __n) {
      sig[0] = '\0';
      sig[1] = '\x01';
      memset(sig + 2,0xff,__n);
      sVar4 = oid_size;
      sig[__n + 2] = '\0';
      if (md_alg == MBEDTLS_MD_NONE) {
        lVar8 = __n + 3;
      }
      else {
        sig[__n + 3] = '0';
        uVar2 = (uchar)oid_size;
        sig[__n + 4] = uVar2 + (uchar)hashlen + '\b';
        sig[__n + 5] = '0';
        sig[__n + 6] = uVar2 + '\x04';
        sig[__n + 7] = '\x06';
        sig[__n + 8] = uVar2;
        memcpy(sig + __n + 9,oid,oid_size);
        lVar3 = sVar4 + __n + 2;
        lVar8 = lVar3 + 0xb;
        (sig + lVar3 + 7)[0] = '\x05';
        (sig + lVar3 + 7)[1] = '\0';
        sig[lVar3 + 9] = '\x04';
        sig[lVar3 + 10] = (uchar)hashlen;
      }
      memcpy(sig + lVar8,hash,(ulong)hashlen);
      if (mode == 0) {
        iVar6 = mbedtls_rsa_public(ctx,sig,sig);
      }
      else {
        sVar7 = ctx->len;
        output = (uchar *)calloc(1,sVar7);
        output_00 = (uchar *)calloc(1,sVar7);
        if (output_00 == (uchar *)0x0 || output == (uchar *)0x0) {
          iVar6 = -0x10;
        }
        else {
          iVar6 = mbedtls_rsa_private(ctx,local_40,local_38,sig,output);
          if ((iVar6 == 0) && (iVar6 = mbedtls_rsa_public(ctx,output,output_00), iVar6 == 0)) {
            bVar5 = 0;
            for (sVar7 = 0; ctx->len != sVar7; sVar7 = sVar7 + 1) {
              bVar5 = bVar5 | sig[sVar7] ^ output_00[sVar7];
            }
            iVar6 = -0x4300;
            if (bVar5 == 0) {
              memcpy(sig,output,ctx->len);
              iVar6 = 0;
            }
          }
          free(output);
          free(output_00);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_sign( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               unsigned char *sig )
{
    size_t nb_pad, olen, oid_size = 0;
    unsigned char *p = sig;
    const char *oid = NULL;
    unsigned char *sig_try = NULL, *verif = NULL;
    size_t i;
    unsigned char diff;
    volatile unsigned char diff_no_optimize;
    int ret;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;
    nb_pad = olen - 3;

    if( md_alg != MBEDTLS_MD_NONE )
    {
        const mbedtls_md_info_t *md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        if( mbedtls_oid_get_oid_by_md( md_alg, &oid, &oid_size ) != 0 )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        nb_pad -= 10 + oid_size;

        hashlen = mbedtls_md_get_size( md_info );
    }

    nb_pad -= hashlen;

    if( ( nb_pad < 8 ) || ( nb_pad > olen ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    *p++ = 0;
    *p++ = MBEDTLS_RSA_SIGN;
    memset( p, 0xFF, nb_pad );
    p += nb_pad;
    *p++ = 0;

    if( md_alg == MBEDTLS_MD_NONE )
    {
        memcpy( p, hash, hashlen );
    }
    else
    {
        /*
         * DigestInfo ::= SEQUENCE {
         *   digestAlgorithm DigestAlgorithmIdentifier,
         *   digest Digest }
         *
         * DigestAlgorithmIdentifier ::= AlgorithmIdentifier
         *
         * Digest ::= OCTET STRING
         */
        *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
        *p++ = (unsigned char) ( 0x08 + oid_size + hashlen );
        *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
        *p++ = (unsigned char) ( 0x04 + oid_size );
        *p++ = MBEDTLS_ASN1_OID;
        *p++ = oid_size & 0xFF;
        memcpy( p, oid, oid_size );
        p += oid_size;
        *p++ = MBEDTLS_ASN1_NULL;
        *p++ = 0x00;
        *p++ = MBEDTLS_ASN1_OCTET_STRING;
        *p++ = hashlen;
        memcpy( p, hash, hashlen );
    }

    if( mode == MBEDTLS_RSA_PUBLIC )
        return( mbedtls_rsa_public(  ctx, sig, sig ) );

    /*
     * In order to prevent Lenstra's attack, make the signature in a
     * temporary buffer and check it before returning it.
     */
    sig_try = mbedtls_calloc( 1, ctx->len );
    verif   = mbedtls_calloc( 1, ctx->len );
    if( sig_try == NULL || verif == NULL )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    MBEDTLS_MPI_CHK( mbedtls_rsa_private( ctx, f_rng, p_rng, sig, sig_try ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_public( ctx, sig_try, verif ) );

    /* Compare in constant time just in case */
    for( diff = 0, i = 0; i < ctx->len; i++ )
        diff |= verif[i] ^ sig[i];
    diff_no_optimize = diff;

    if( diff_no_optimize != 0 )
    {
        ret = MBEDTLS_ERR_RSA_PRIVATE_FAILED;
        goto cleanup;
    }

    memcpy( sig, sig_try, ctx->len );

cleanup:
    mbedtls_free( sig_try );
    mbedtls_free( verif );

    return( ret );
}